

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cxx
# Opt level: O3

int serialization_test::srv_config_test(void)

{
  char *pcVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  ostream *poVar9;
  ptr<srv_config> srv_conf;
  string _v;
  ptr<srv_config> srv_conf1;
  ptr<buffer> srv_conf_buf;
  string _ev;
  srv_config *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  string *local_100;
  size_t local_f8;
  string local_f0 [16];
  int *local_e0;
  _Alloc_hider local_d8;
  undefined1 local_d0 [16];
  int local_c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [6];
  char *local_38;
  pthread_t local_30;
  
  local_c0[0] = rnd();
  local_38 = "server %d";
  uVar6 = rnd();
  snprintf((char *)local_a0,100,"server %d",(ulong)uVar6);
  local_110 = (srv_config *)0x0;
  local_100 = local_a0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::srv_config,std::allocator<nuraft::srv_config>,int,char_const*>
            (&local_108,&local_110,(allocator<nuraft::srv_config> *)local_d0,local_c0,
             (char **)&local_100);
  nuraft::srv_config::serialize((srv_config *)local_d0);
  nuraft::srv_config::deserialize((srv_config *)&local_e0,(buffer *)local_d0._0_8_);
  pcVar1 = local_98[0]._M_local_buf + 8;
  pcVar3 = (local_110->endpoint_)._M_dataplus._M_p;
  local_a0 = (string  [8])pcVar1;
  std::__cxx11::string::_M_construct<char*>
            (local_a0,pcVar3,pcVar3 + (local_110->endpoint_)._M_string_length);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,*(long *)(local_e0 + 2),
             *(long *)(local_e0 + 4) + *(long *)(local_e0 + 2));
  psVar5 = local_100;
  if (local_98[0]._M_allocated_capacity == local_f8) {
    if (local_98[0]._M_allocated_capacity != 0) {
      iVar7 = bcmp((void *)local_a0,local_100,local_98[0]._M_allocated_capacity);
      if (iVar7 != 0) goto LAB_00106f5b;
    }
    if (psVar5 != local_f0) {
      operator_delete(psVar5);
    }
    if (local_a0 != (string  [8])pcVar1) {
      operator_delete((void *)local_a0);
    }
    iVar7 = local_110->id_;
    iVar2 = *local_e0;
    if (iVar7 != iVar2) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      poVar8 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_a0,local_98[0]._M_allocated_capacity);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[33m",5);
      lVar4 = *(long *)poVar8;
      *(uint *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x10) = 4;
      poVar9 = poVar8 + *(long *)(lVar4 + -0x18);
      if (poVar8[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar9);
        poVar9[0xe1] = (ostream)0x1;
      }
      poVar9[0xe0] = (ostream)0x30;
      local_100 = (string *)pthread_self();
      std::_Hash_bytes(&local_100,8,0xc70f6907);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"srv_config_test",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;35m",7);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"    value of: \x1b[1;34msrv_conf1->get_id()\x1b[0m\n",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    expected: \x1b[1;32m",0x15);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      actual: \x1b[1;31m",0x15);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
      if (local_a0 != (string  [8])pcVar1) {
        operator_delete((void *)local_a0);
      }
      TestSuite::failHandler();
    }
    iVar7 = -(uint)(iVar7 != iVar2);
  }
  else {
LAB_00106f5b:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)CONCAT44(local_c0[1],local_c0[0]),
                        local_b8._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[33m",5);
    lVar4 = *(long *)poVar8;
    *(uint *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar4 + -0x18) + 0x10) = 4;
    poVar9 = poVar8 + *(long *)(lVar4 + -0x18);
    if (poVar8[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar9);
      poVar9[0xe1] = (ostream)0x1;
    }
    poVar9[0xe0] = (ostream)0x30;
    local_30 = pthread_self();
    std::_Hash_bytes(&local_30,8,0xc70f6907);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"srv_config_test",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;35m",7);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    value of: \x1b[1;34msrv_conf1->get_endpoint()\x1b[0m\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    expected: \x1b[1;32m",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_a0,local_98[0]._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      actual: \x1b[1;31m",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_100,local_f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
    if ((char *)CONCAT44(local_c0[1],local_c0[0]) != local_b8._M_local_buf + 8) {
      operator_delete((char *)CONCAT44(local_c0[1],local_c0[0]));
    }
    TestSuite::failHandler();
    if (local_100 != local_f0) {
      operator_delete(local_100);
    }
    if (local_a0 != (string  [8])pcVar1) {
      operator_delete((void *)local_a0);
    }
    iVar7 = -1;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
  }
  return iVar7;
}

Assistant:

int srv_config_test() {
    ptr<srv_config> srv_conf
                    ( cs_new<srv_config>
                      ( rnd(),
                        sstrfmt("server %d").fmt( rnd() ) ) );
    ptr<buffer> srv_conf_buf( srv_conf->serialize() );

    ptr<srv_config> srv_conf1( srv_config::deserialize(*srv_conf_buf) );

    CHK_EQ( srv_conf->get_endpoint(), srv_conf1->get_endpoint() );
    CHK_EQ( srv_conf->get_id(), srv_conf1->get_id() );

    return 0;
}